

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O0

Gia_ObjEra_t * Gia_ManEraCreateState(Gia_ManEra_t *p)

{
  int iVar1;
  Gia_ObjEra_t *Entry;
  Gia_ObjEra_t *pNew;
  Gia_ManEra_t *p_local;
  
  Entry = (Gia_ObjEra_t *)Mem_FixedEntryFetch(p->pMemory);
  iVar1 = Vec_PtrSize(p->vStates);
  Entry->Num = iVar1;
  Entry->iPrev = 0;
  Vec_PtrPush(p->vStates,Entry);
  return Entry;
}

Assistant:

Gia_ObjEra_t * Gia_ManEraCreateState( Gia_ManEra_t * p )
{
    Gia_ObjEra_t * pNew;
    pNew = (Gia_ObjEra_t *)Mem_FixedEntryFetch( p->pMemory );
    pNew->Num = Vec_PtrSize( p->vStates );
    pNew->iPrev = 0;
    Vec_PtrPush( p->vStates, pNew );
    return pNew;
}